

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O2

void u8_to_u_test(int line,UTF_S8 *str1,UTF_US16 *str2,bool ok)

{
  UTF_UC8 uc8_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined2 *puVar5;
  UTF_UC8 *pUVar6;
  UTF_UC8 *pUVar7;
  UTF_UC8 *pUVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  UTF_UC16 local_260;
  short sStack_25e;
  UTF_UC8 uc8 [4];
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = L'\0';
  bVar1 = UTF_u8_to_u<(char)63>((UTF_US8 *)str1,&tmp);
  UTF_test(line,bVar1 == ok);
  bVar1 = std::operator==(&tmp,str2);
  UTF_test(line,bVar1);
  pUVar7 = (UTF_UC8 *)(str1->_M_dataplus)._M_p;
  pUVar8 = pUVar7 + str1->_M_string_length;
  lVar9 = 0;
  do {
    puVar5 = (undefined2 *)((long)buf + lVar9);
    bVar11 = pUVar7 == pUVar8;
    bVar1 = true;
    if (bVar11) {
LAB_001014a7:
      *puVar5 = 0;
      UTF_test(line,bVar1);
      iVar3 = UTF_uj16_cmpn(tmp._M_dataplus._M_p,buf,tmp._M_string_length + 1);
      UTF_test(line,iVar3 == 0);
      std::__cxx11::u16string::~u16string((u16string *)&tmp);
      return;
    }
    uc8_00 = *pUVar7;
    uVar2 = UTF_uc8_count(uc8_00);
    if (uVar2 == 0) {
      if (lVar9 == 0x1fe) {
LAB_0010149a:
        bVar1 = false;
        goto LAB_001014a7;
      }
      *(undefined2 *)((long)buf + lVar9) = 0x3f;
      lVar10 = lVar9 + 2;
    }
    else {
      for (uVar4 = 1; pUVar6 = pUVar7 + 1, uc8[0] = uc8_00, uVar2 != uVar4; uVar4 = uVar4 + 1) {
        if (pUVar6 == pUVar8) {
          if (lVar9 == 0x1fe) goto LAB_0010149a;
          *puVar5 = 0x3f;
          puVar5 = (undefined2 *)((long)buf + lVar9 + 2);
          goto LAB_001014a7;
        }
        uc8[uVar4] = *pUVar6;
        pUVar7 = pUVar6;
      }
      bVar1 = UTF_uc8_to_uc16(uc8,&local_260);
      if (!bVar1) {
        _local_260 = 0x3f;
      }
      bVar1 = bVar11;
      if (lVar9 == 0x1fe) goto LAB_001014a7;
      lVar10 = lVar9 + 2;
      *(UTF_UC16 *)((long)buf + lVar9) = local_260;
      if (sStack_25e != 0) {
        if (lVar10 == 0x1fe) {
          puVar5 = (undefined2 *)((long)buf + lVar9 + 2);
          goto LAB_001014a7;
        }
        *(short *)((long)buf + lVar9 + 2) = sStack_25e;
        lVar10 = lVar9 + 4;
      }
    }
    pUVar7 = pUVar7 + 1;
    lVar9 = lVar10;
  } while( true );
}

Assistant:

void u8_to_u_test(int line, const UTF_S8& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_u8_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}